

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_decimal_result<char_*> __thiscall
fmt::v8::detail::format_decimal<char,unsigned__int128>
          (detail *this,char *out,unsigned___int128 value,int size)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar3;
  undefined8 unaff_RBX;
  char *pcVar4;
  ulong uVar5;
  detail *pdVar6;
  detail *pdVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  format_decimal_result<char_*> fVar11;
  detail *pdVar12;
  
  uVar3 = CONCAT44(in_register_00000014,size);
  auVar10._8_8_ = unaff_RBX;
  auVar10._0_8_ = in_RAX;
  iVar2 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar10);
  if (in_ECX < iVar2) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
               ,0x45e,"invalid digit count");
  }
  pdVar6 = this + in_ECX;
  pcVar4 = out;
  uVar5 = uVar3;
  pdVar7 = pdVar6;
  pdVar12 = pdVar6;
  if ((out < (char *)0x64) <= uVar3) {
    do {
      pdVar6 = pdVar7 + -2;
      auVar10 = __udivti3(pcVar4,uVar5,100,0);
      uVar3 = auVar10._8_8_;
      out = auVar10._0_8_;
      bVar8 = (char *)0x270f < pcVar4;
      bVar9 = uVar5 != 0;
      uVar1 = -uVar5;
      *(undefined2 *)(pdVar7 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (long)(pcVar4 + (long)out * -100) * 2);
      pcVar4 = out;
      uVar5 = uVar3;
      pdVar7 = pdVar6;
    } while (bVar9 || uVar1 < bVar8);
  }
  if (uVar3 == 0 && (ulong)((char *)0x9 < out) <= -uVar3) {
    pdVar6[-1] = (detail)((byte)out | 0x30);
    pdVar6 = pdVar6 + -1;
  }
  else {
    *(undefined2 *)(pdVar6 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (long)out * 2);
    pdVar6 = pdVar6 + -2;
  }
  fVar11.end = (char *)pdVar12;
  fVar11.begin = (char *)pdVar6;
  return fVar11;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}